

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

bool __thiscall
LoaderLogger::LogDebugUtilsMessage
          (LoaderLogger *this,XrDebugUtilsMessageSeverityFlagsEXT message_severity,
          XrDebugUtilsMessageTypeFlagsEXT message_type,
          XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  bool bVar1;
  XrLoaderLogType XVar2;
  uint uVar3;
  XrLoaderLogMessageSeverityFlags XVar4;
  reference this_00;
  pointer pLVar5;
  XrLoaderLogMessageSeverityFlags XVar6;
  XrLoaderLogMessageTypeFlags XVar7;
  bool bVar8;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  *__range1;
  shared_lock<std::shared_timed_mutex> lock;
  undefined1 local_c0 [8];
  AugmentedCallbackData augmented_data;
  XrLoaderLogMessageTypeFlags log_message_type;
  XrLoaderLogMessageSeverityFlags log_message_severity;
  bool exit_app;
  XrDebugUtilsMessengerCallbackDataEXT *callback_data_local;
  XrDebugUtilsMessageTypeFlagsEXT message_type_local;
  XrDebugUtilsMessageSeverityFlagsEXT message_severity_local;
  LoaderLogger *this_local;
  
  bVar8 = false;
  XVar4 = DebugUtilsSeveritiesToLoaderLogMessageSeverities(message_severity);
  augmented_data.exported_data =
       (XrDebugUtilsMessengerCallbackDataEXT *)
       DebugUtilsMessageTypesToLoaderLogMessageTypes(message_type);
  AugmentedCallbackData::AugmentedCallbackData((AugmentedCallbackData *)local_c0);
  DebugUtilsData::WrapCallbackData(&this->data_,(AugmentedCallbackData *)local_c0,callback_data);
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)&__range1,&this->_mutex);
  __end1 = std::
           vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ::begin(&this->_recorders);
  recorder = (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
             std::
             vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
             ::end(&this->_recorders);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
                                     *)&recorder), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
              ::operator*(&__end1);
    pLVar5 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::operator->
                       (this_00);
    XVar2 = LoaderLogRecorder::Type(pLVar5);
    if (XVar2 == XR_LOADER_LOG_DEBUG_UTILS) {
      pLVar5 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::
               operator->(this_00);
      XVar6 = LoaderLogRecorder::MessageSeverities(pLVar5);
      if ((XVar6 & XVar4) == XVar4) {
        pLVar5 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::
                 operator->(this_00);
        XVar7 = LoaderLogRecorder::MessageTypes(pLVar5);
        if ((XrDebugUtilsMessengerCallbackDataEXT *)(XVar7 & (ulong)augmented_data.exported_data) ==
            augmented_data.exported_data) {
          pLVar5 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::
                   operator->(this_00);
          uVar3 = (*pLVar5->_vptr_LoaderLogRecorder[7])
                            (pLVar5,message_severity,message_type,
                             augmented_data.modified_data.sessionLabels);
          bVar8 = bVar8 != false || (uVar3 & 1) != 0;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_*,_std::vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)&__range1);
  AugmentedCallbackData::~AugmentedCallbackData((AugmentedCallbackData *)local_c0);
  return bVar8;
}

Assistant:

bool LoaderLogger::LogDebugUtilsMessage(XrDebugUtilsMessageSeverityFlagsEXT message_severity,
                                        XrDebugUtilsMessageTypeFlagsEXT message_type,
                                        const XrDebugUtilsMessengerCallbackDataEXT* callback_data) {
    bool exit_app = false;
    XrLoaderLogMessageSeverityFlags log_message_severity = DebugUtilsSeveritiesToLoaderLogMessageSeverities(message_severity);
    XrLoaderLogMessageTypeFlags log_message_type = DebugUtilsMessageTypesToLoaderLogMessageTypes(message_type);

    AugmentedCallbackData augmented_data;
    data_.WrapCallbackData(&augmented_data, callback_data);

    // Loop through the recorders
    std::shared_lock<std::shared_timed_mutex> lock(_mutex);
    for (std::unique_ptr<LoaderLogRecorder>& recorder : _recorders) {
        // Only send the message if it's a debug utils recorder and of the type the recorder cares about.
        if (recorder->Type() != XR_LOADER_LOG_DEBUG_UTILS ||
            (recorder->MessageSeverities() & log_message_severity) != log_message_severity ||
            (recorder->MessageTypes() & log_message_type) != log_message_type) {
            continue;
        }

        exit_app |= recorder->LogDebugUtilsMessage(message_severity, message_type, augmented_data.exported_data);
    }
    return exit_app;
}